

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1539::run(TestCase1539 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  Type *func;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Type *func_00;
  Type *extraout_RDX_01;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  MessageSize MVar6;
  ReaderOptions options;
  uint64_t local_668;
  uint local_660;
  unsigned_long local_658;
  bool local_649;
  uint64_t uStack_648;
  bool _kj_shouldLog_2;
  uint local_640;
  bool local_631;
  undefined1 *puStack_630;
  bool _kj_shouldLog_1;
  Maybe<kj::Exception> local_628;
  bool local_4c1;
  undefined1 *puStack_4c0;
  bool _kj_shouldLog;
  Maybe<kj::Exception> local_4b8;
  Reader local_358;
  undefined1 local_338 [8];
  ReaderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>_>
  listListReader;
  Reader root;
  undefined1 local_2b0 [8];
  SegmentArrayMessageReader reader;
  int local_1bc;
  Fault local_1b8;
  Fault f;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  uint local_178;
  uint i;
  Builder local_168;
  Builder local_140;
  undefined1 local_128 [8];
  BuilderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct>_>_> listList;
  MallocMessageBuilder builder;
  TestCase1539 *this_local;
  
  this_00 = &listList.builder.structDataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&local_168,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField(&local_140,&local_168);
  AnyPointer::Builder::
  initAs<capnp::List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct,(capnp::Kind)3>,(capnp::Kind)6>>
            ((BuilderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct>_>_> *
             )local_128,&local_140,500);
  for (local_178 = 0;
      uVar2 = List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct,_(capnp::Kind)3>,_(capnp::Kind)6>
              ::Builder::size((Builder *)local_128), local_178 < uVar2; local_178 = local_178 + 1) {
    List<capnp::List<capnproto_test::capnp::test::TestEmptyStruct,_(capnp::Kind)3>,_(capnp::Kind)6>
    ::Builder::init((Builder *)&segments.size_,(EVP_PKEY_CTX *)local_128);
  }
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&listList.builder.structDataSize);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar5.size_;
  f.exception = (Exception *)AVar5.ptr;
  sVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
  if (sVar3 != 1) {
    local_1bc = 1;
    reader.segments.size_ =
         kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                   ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
               ,0x60d,FAILED,"(1) == (segments.size())","1, segments.size()",&local_1bc,
               &reader.segments.size_);
    kj::_::Debug::Fault::fatal(&local_1b8);
  }
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&listList.builder.structDataSize);
  root._reader.nestingLimit = 0;
  root._reader._44_4_ = 0;
  ReaderOptions::ReaderOptions((ReaderOptions *)&root._reader.nestingLimit);
  options._8_8_ = 0;
  options.traversalLimitInWords = root._reader._40_8_;
  SegmentArrayMessageReader::SegmentArrayMessageReader
            ((SegmentArrayMessageReader *)local_2b0,AVar5,options);
  MessageReader::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Reader *)&listListReader.reader.nestingLimit,(MessageReader *)local_2b0);
  capnproto_test::capnp::test::TestAnyPointer::Reader::getAnyPointerField
            (&local_358,(Reader *)&listListReader.reader.nestingLimit);
  AnyPointer::Reader::
  getAs<capnp::List<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>,(capnp::Kind)6>>
            ((ReaderFor<capnp::List<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>,_(capnp::Kind)6>_>
              *)local_338,&local_358);
  puStack_4c0 = local_338;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1539::run()::__0>
            (&local_4b8,(kj *)&stack0xfffffffffffffb40,func);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_4b8,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_4b8);
  func_00 = extraout_RDX;
  if (!bVar1) {
    local_4c1 = kj::_::Debug::shouldLog(ERROR);
    func_00 = extraout_RDX_00;
    while (local_4c1 != false) {
      kj::_::Debug::log<char_const(&)[84]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x612,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { listListReader[0]; }) != nullptr\""
                 ,(char (*) [84])
                  "failed: expected kj::runCatchingExceptions([&]() { listListReader[0]; }) != nullptr"
                );
      func_00 = extraout_RDX_01;
      local_4c1 = false;
    }
  }
  puStack_630 = local_338;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase1539::run()::__1>
            (&local_628,(kj *)&stack0xfffffffffffff9d0,func_00);
  bVar1 = kj::Maybe<kj::Exception>::operator!=(&local_628,(void *)0x0);
  kj::Maybe<kj::Exception>::~Maybe(&local_628);
  if (!bVar1) {
    local_631 = kj::_::Debug::shouldLog(ERROR);
    while (local_631 != false) {
      kj::_::Debug::log<char_const(&)[85]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x613,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { listListReader[10]; }) != nullptr\""
                 ,(char (*) [85])
                  "failed: expected kj::runCatchingExceptions([&]() { listListReader[10]; }) != nullptr"
                );
      local_631 = false;
    }
  }
  pAVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
  sVar3 = kj::ArrayPtr<const_capnp::word>::size(pAVar4);
  MVar6 = capnproto_test::capnp::test::TestAnyPointer::Reader::totalSize
                    ((Reader *)&listListReader.reader.nestingLimit);
  uStack_648 = MVar6.wordCount;
  local_640 = MVar6.capCount;
  if (sVar3 - 1 != uStack_648) {
    local_649 = kj::_::Debug::shouldLog(ERROR);
    while (local_649 != false) {
      pAVar4 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f,0);
      sVar3 = kj::ArrayPtr<const_capnp::word>::size(pAVar4);
      local_658 = sVar3 - 1;
      MVar6 = capnproto_test::capnp::test::TestAnyPointer::Reader::totalSize
                        ((Reader *)&listListReader.reader.nestingLimit);
      local_668 = MVar6.wordCount;
      local_660 = MVar6.capCount;
      kj::_::Debug::log<char_const(&)[74],unsigned_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x615,ERROR,
                 "\"failed: expected \" \"(segments[0].size() - 1) == (root.totalSize().wordCount)\", segments[0].size() - 1, root.totalSize().wordCount"
                 ,(char (*) [74])
                  "failed: expected (segments[0].size() - 1) == (root.totalSize().wordCount)",
                 &local_658,&local_668);
      local_649 = false;
    }
  }
  SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_2b0);
  MallocMessageBuilder::~MallocMessageBuilder
            ((MallocMessageBuilder *)&listList.builder.structDataSize);
  return;
}

Assistant:

TEST(Encoding, EmptyStructListAmplification) {
  MallocMessageBuilder builder(1024);
  auto listList = builder.initRoot<test::TestAnyPointer>().getAnyPointerField()
      .initAs<List<List<test::TestEmptyStruct>>>(500);

  for (uint i = 0; i < listList.size(); i++) {
    listList.init(i, 1u << 28);
  }

  auto segments = builder.getSegmentsForOutput();
  ASSERT_EQ(1, segments.size());

  SegmentArrayMessageReader reader(builder.getSegmentsForOutput());
  auto root = reader.getRoot<test::TestAnyPointer>();
  auto listListReader = root.getAnyPointerField().getAs<List<List<TestAllTypes>>>();
  EXPECT_NONFATAL_FAILURE(listListReader[0]);
  EXPECT_NONFATAL_FAILURE(listListReader[10]);

  EXPECT_EQ(segments[0].size() - 1, root.totalSize().wordCount);
}